

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O2

RotMat3x3d * __thiscall
OpenMD::StuntDouble::getA(RotMat3x3d *__return_storage_ptr__,StuntDouble *this,int snapshotNo)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->snapshotMan_->_vptr_SnapshotManager[4])
                    (this->snapshotMan_,(ulong)(uint)snapshotNo);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)__return_storage_ptr__,
             (RectMatrix<double,_3U,_3U> *)
             ((long)this->localIndex_ * 0x48 +
             *(long *)(CONCAT44(extraout_var,iVar1) + 0x48 + this->storage_)));
  return __return_storage_ptr__;
}

Assistant:

RotMat3x3d getA(int snapshotNo) {
      return ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
          .aMat[localIndex_];
    }